

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CDirectiveFile.cpp
# Opt level: O2

bool __thiscall CDirectiveFile::Validate(CDirectiveFile *this,ValidateState *state)

{
  int iVar1;
  FileManager *this_00;
  int64_t iVar2;
  Architecture *pAVar3;
  char **in_RCX;
  ErrorType type;
  shared_ptr<AssemblerFile> sStack_38;
  __shared_ptr<AssemblerFile,_(__gnu_cxx::_Lock_policy)2> local_28;
  
  if (state->noFileChange == true) {
    if (*(int *)&(this->super_CAssemblerCommand).field_0x14 == 4) {
      type = 0x17e80c;
    }
    else {
      type = 0x17e828;
    }
    Logger::queueError<char_const*>((Logger *)0x1,type,(char *)&state->noFileChangeDirective,in_RCX)
    ;
  }
  else {
    iVar2 = FileManager::getVirtualAddress(g_fileManager);
    this->virtualAddress = iVar2;
    pAVar3 = Architecture::current();
    (*pAVar3->_vptr_Architecture[3])(pAVar3);
    this_00 = g_fileManager;
    iVar1 = *(int *)&(this->super_CAssemblerCommand).field_0x14;
    if (iVar1 - 1U < 3) {
      std::__shared_ptr<AssemblerFile,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<GenericAssemblerFile,void>
                ((__shared_ptr<AssemblerFile,(__gnu_cxx::_Lock_policy)2> *)&sStack_38,
                 &(this->file).super___shared_ptr<GenericAssemblerFile,_(__gnu_cxx::_Lock_policy)2>)
      ;
      FileManager::openFile(this_00,&sStack_38,true);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&sStack_38.super___shared_ptr<AssemblerFile,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
    }
    else if (iVar1 == 4) {
      std::__shared_ptr<AssemblerFile,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_28,
                 &(g_fileManager->activeFile).
                  super___shared_ptr<AssemblerFile,_(__gnu_cxx::_Lock_policy)2>);
      std::__shared_ptr<AssemblerFile,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&(this->closeFile).super___shared_ptr<AssemblerFile,_(__gnu_cxx::_Lock_policy)2>,
                 &local_28);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28._M_refcount);
      FileManager::closeFile(g_fileManager);
    }
  }
  return false;
}

Assistant:

bool CDirectiveFile::Validate(const ValidateState &state)
{
	if (state.noFileChange)
	{
		if (type == Type::Close)
			Logger::queueError(Logger::Error, "Cannot close file within %S", state.noFileChangeDirective);
		else
			Logger::queueError(Logger::Error, "Cannot open new file within %S", state.noFileChangeDirective);
		return false;
	}

	virtualAddress = g_fileManager->getVirtualAddress();
	Architecture::current().NextSection();

	switch (type)
	{
	case Type::Open:
	case Type::Create:
	case Type::Copy:
		g_fileManager->openFile(file,true);
		return false;
	case Type::Close:
		closeFile = g_fileManager->getOpenFile();
		g_fileManager->closeFile();
		return false;
	case Type::Invalid:
		break;
	}
	
	return false;
}